

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddAbs.c
# Opt level: O0

DdNode * cuddBddBooleanDiffRecur(DdManager *manager,DdNode *f,DdNode *var)

{
  DdNode *g;
  DdNode *pDVar1;
  DdHalfWord local_54;
  DdNode *res2;
  DdNode *res1;
  DdNode *res;
  DdNode *E;
  DdNode *T;
  DdNode *var_local;
  DdNode *f_local;
  DdManager *manager_local;
  
  if (f->index == 0x7fffffff) {
    local_54 = f->index;
  }
  else {
    local_54 = manager->perm[f->index];
  }
  if (manager->perm[var->index] < (int)local_54) {
    manager_local = (DdManager *)((ulong)manager->one ^ 1);
  }
  else if (f->index == var->index) {
    manager_local = (DdManager *)cuddBddXorRecur(manager,(f->type).kids.T,(f->type).kids.E);
  }
  else {
    manager_local = (DdManager *)cuddCacheLookup2(manager,cuddBddBooleanDiffRecur,f,var);
    if (manager_local == (DdManager *)0x0) {
      pDVar1 = (f->type).kids.E;
      g = cuddBddBooleanDiffRecur(manager,(f->type).kids.T,var);
      if (g == (DdNode *)0x0) {
        manager_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + 1;
        pDVar1 = cuddBddBooleanDiffRecur(manager,(DdNode *)((ulong)pDVar1 & 0xfffffffffffffffe),var)
        ;
        if (pDVar1 == (DdNode *)0x0) {
          Cudd_IterDerefBdd(manager,g);
          manager_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          manager_local = (DdManager *)cuddBddIteRecur(manager,manager->vars[f->index],g,pDVar1);
          if (manager_local == (DdManager *)0x0) {
            Cudd_IterDerefBdd(manager,g);
            Cudd_IterDerefBdd(manager,pDVar1);
            manager_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + -1;
            *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
            cuddCacheInsert2(manager,cuddBddBooleanDiffRecur,f,var,(DdNode *)manager_local);
          }
        }
      }
    }
  }
  return &manager_local->sentinel;
}

Assistant:

DdNode *
cuddBddBooleanDiffRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * var)
{
    DdNode *T, *E, *res, *res1, *res2;

    statLine(manager);
    if (cuddI(manager,f->index) > manager->perm[var->index]) {
        /* f does not depend on var. */
        return(Cudd_Not(DD_ONE(manager)));
    }

    /* From now on, f is non-constant. */

    /* If the two indices are the same, so are their levels. */
    if (f->index == var->index) {
        res = cuddBddXorRecur(manager, cuddT(f), cuddE(f));
        return(res);
    }

    /* From now on, cuddI(manager,f->index) < cuddI(manager,cube->index). */

    /* Check the cache. */
    res = cuddCacheLookup2(manager, cuddBddBooleanDiffRecur, f, var);
    if (res != NULL) {
        return(res);
    }

    /* Compute the cofactors of f. */
    T = cuddT(f); E = cuddE(f);

    res1 = cuddBddBooleanDiffRecur(manager, T, var);
    if (res1 == NULL) return(NULL);
    cuddRef(res1);
    res2 = cuddBddBooleanDiffRecur(manager, Cudd_Regular(E), var);
    if (res2 == NULL) {
        Cudd_IterDerefBdd(manager, res1);
        return(NULL);
    }
    cuddRef(res2);
    /* ITE takes care of possible complementation of res1 and of the
    ** case in which res1 == res2. */
    res = cuddBddIteRecur(manager, manager->vars[f->index], res1, res2);
    if (res == NULL) {
        Cudd_IterDerefBdd(manager, res1);
        Cudd_IterDerefBdd(manager, res2);
        return(NULL);
    }
    cuddDeref(res1);
    cuddDeref(res2);
    cuddCacheInsert2(manager, cuddBddBooleanDiffRecur, f, var, res);
    return(res);

}